

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
     ::load(iarchive *ar,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,uint param_3)

{
  uchar *data_00;
  uint uVar1;
  ulong in_RAX;
  size_type __n;
  error *this;
  undefined4 in_register_00000014;
  undefined8 uStack_18;
  
  uVar1 = (ar->reader).decoder.current.code - array8_int8;
  if ((uVar1 * 0x10000000 | uVar1 >> 4) < 4) {
    uStack_18 = in_RAX;
    __n = bintoken::reader::length(&ar->reader);
    uStack_18 = uStack_18 & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (data,__n,(value_type_conflict1 *)((long)&uStack_18 + 7));
    data_00 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    bintoken::iarchive::load_array<unsigned_char>
              (ar,data_00,
               (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)data_00);
    return;
  }
  this = (error *)__cxa_allocate_exception(0x20,data,CONCAT44(in_register_00000014,param_3));
  bintoken::error::error(this,incompatible_type);
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(bintoken::iarchive& ar,
                     std::vector<std::uint8_t, Allocator>& data,
                     const unsigned int /* protocol_version */)
    {
        switch (ar.code())
        {
        case bintoken::token::code::array8_int8:
        case bintoken::token::code::array16_int8:
        case bintoken::token::code::array32_int8:
        case bintoken::token::code::array64_int8:
            data.assign(ar.length(), {});
            ar.load_array(data.data(), data.size());
            break;

        default:
            throw bintoken::error(bintoken::incompatible_type);
        }
    }